

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_aux_data * ContextFindChunk(jx9_context *pCtx,void *pChunk)

{
  jx9_aux_data *pjVar1;
  jx9_aux_data *pjVar2;
  ulong uVar3;
  jx9_aux_data *pjVar4;
  bool bVar5;
  
  uVar3 = (ulong)(pCtx->sChunk).nUsed;
  if (uVar3 != 0) {
    pjVar4 = (jx9_aux_data *)((long)(pCtx->sChunk).pBase + -8);
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      pjVar1 = pjVar4 + 1;
      pjVar2 = pjVar4 + 1;
      pjVar4 = pjVar1;
      if (pjVar2->pAuxData == pChunk) {
        return pjVar1;
      }
    }
  }
  return (jx9_aux_data *)0x0;
}

Assistant:

static jx9_aux_data * ContextFindChunk(jx9_context *pCtx, void *pChunk)
{
	jx9_aux_data *aAux, *pAux;
	sxu32 n;
	if( SySetUsed(&pCtx->sChunk) < 1 ){
		/* Don't bother processing, the container is empty */
		return 0;
	}
	/* Perform the lookup */
	aAux = (jx9_aux_data *)SySetBasePtr(&pCtx->sChunk);
	for( n = 0; n < SySetUsed(&pCtx->sChunk) ; ++n ){
		pAux = &aAux[n];
		if( pAux->pAuxData == pChunk ){
			/* Chunk found */
			return pAux;
		}
	}
	/* No such allocated chunk */
	return 0;
}